

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode Curl_http2_upgrade(Curl_easy *data,connectdata *conn,int sockindex,char *mem,size_t nread)

{
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  ulong uVar4;
  ulong extraout_RAX;
  CURLcode result;
  _Bool done;
  Curl_cfilter *cf;
  CURLcode local_40;
  _Bool local_39;
  Curl_cfilter *local_38;
  
  local_40 = http2_cfilter_add(&local_38,data,conn,sockindex);
  if (local_40 == CURLE_OK) {
    pvVar2 = local_38->ctx;
    local_40 = cf_h2_ctx_init(local_38,data,true);
    if (local_40 == CURLE_OK) {
      if (nread != 0) {
        uVar4 = Curl_bufq_write((bufq *)((long)pvVar2 + 0x18),(uchar *)mem,nread,&local_40);
        if ((long)uVar4 < 0) {
          bVar3 = false;
          Curl_failf(data,"error on copying HTTP Upgrade response: %d",(ulong)local_40);
          uVar4 = 0x38;
        }
        else if (uVar4 < nread) {
          bVar3 = false;
          Curl_failf(data,
                     "connection buffer size could not take all data from HTTP Upgrade response header: copied=%zd, datalen=%zu"
                     ,uVar4,nread);
          uVar4 = 0x10;
        }
        else {
          bVar3 = true;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,
                       "Copied HTTP/2 data in stream buffer to connection buffer after upgrade: len=%zu"
                       ,nread);
            uVar4 = extraout_RAX;
          }
        }
        if (!bVar3) {
          return (CURLcode)uVar4;
        }
      }
      conn->httpversion = '\x14';
      puVar1 = &(conn->bits).field_0x2;
      *puVar1 = *puVar1 | 0x80;
      conn->bundle->multiuse = 2;
      Curl_multi_connchanged(data->multi);
      if (local_38->next == (Curl_cfilter *)0x0) {
        local_40 = CURLE_OK;
      }
      else {
        local_40 = Curl_conn_cf_connect(local_38,data,false,&local_39);
      }
    }
  }
  return local_40;
}

Assistant:

CURLcode Curl_http2_upgrade(struct Curl_easy *data,
                            struct connectdata *conn, int sockindex,
                            const char *mem, size_t nread)
{
  struct Curl_cfilter *cf;
  struct cf_h2_ctx *ctx;
  CURLcode result;

  DEBUGASSERT(!Curl_conn_is_http2(data, conn, sockindex));
  DEBUGF(infof(data, "upgrading to HTTP/2"));
  DEBUGASSERT(data->req.upgr101 == UPGR101_RECEIVED);

  result = http2_cfilter_add(&cf, data, conn, sockindex);
  if(result)
    return result;

  DEBUGASSERT(cf->cft == &Curl_cft_nghttp2);
  ctx = cf->ctx;

  result = cf_h2_ctx_init(cf, data, TRUE);
  if(result)
    return result;

  if(nread > 0) {
    /* Remaining data from the protocol switch reply is already using
     * the switched protocol, ie. HTTP/2. We add that to the network
     * inbufq. */
    ssize_t copied;

    copied = Curl_bufq_write(&ctx->inbufq,
                             (const unsigned char *)mem, nread, &result);
    if(copied < 0) {
      failf(data, "error on copying HTTP Upgrade response: %d", result);
      return CURLE_RECV_ERROR;
    }
    if((size_t)copied < nread) {
      failf(data, "connection buffer size could not take all data "
            "from HTTP Upgrade response header: copied=%zd, datalen=%zu",
            copied, nread);
      return CURLE_HTTP2;
    }
    infof(data, "Copied HTTP/2 data in stream buffer to connection buffer"
          " after upgrade: len=%zu", nread);
  }

  conn->httpversion = 20; /* we know we're on HTTP/2 now */
  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf->next) {
    bool done;
    return Curl_conn_cf_connect(cf, data, FALSE, &done);
  }
  return CURLE_OK;
}